

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

void Saig_RefManFindReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vPrios,Vec_Int_t *vReasons)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  uint uVar6;
  Aig_Obj_t *pAVar7;
  uint uVar8;
  Aig_Obj_t **ppAVar9;
  
LAB_004a954c:
  pObj_00 = pObj;
  if (pObj_00->TravId == p->nTravIds) {
    return;
  }
  pObj_00->TravId = p->nTravIds;
  uVar5 = (uint)*(ulong *)&pObj_00->field_0x18;
  if ((uVar5 & 7) == 2) {
    iVar3 = Aig_ObjCioId(pObj_00);
    Vec_IntPush(vReasons,iVar3);
    return;
  }
  if ((uVar5 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x82,
                  "void Saig_RefManFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  pAVar1 = pObj_00->pFanin0;
  if ((*(ulong *)&pObj_00->field_0x18 & 8) == 0) goto code_r0x004a9597;
  Saig_RefManFindReason_rec(p,(Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe),vPrios,vReasons);
  ppAVar9 = &pObj_00->pFanin1;
  goto LAB_004a964e;
code_r0x004a9597:
  uVar5 = (uint)pAVar1 & 1;
  pAVar4 = (Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe);
  uVar6 = *(uint *)&pAVar4->field_0x18 >> 3 & 1;
  pAVar7 = (Aig_Obj_t *)((ulong)pObj_00->pFanin1 & 0xfffffffffffffffe);
  uVar8 = (*(uint *)&pAVar7->field_0x18 >> 3 ^ (uint)pObj_00->pFanin1) & 1;
  if ((uVar5 != uVar6) && (uVar8 != 0)) {
    __assert_fail("!fPhase0 || !fPhase1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x8c,
                  "void Saig_RefManFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (((uVar5 != uVar6) || (pObj = pAVar4, uVar8 == 0)) &&
     ((uVar5 == uVar6 || (pObj = pAVar7, uVar8 != 0)))) {
    iVar3 = -1;
    if (pAVar1 != (Aig_Obj_t *)0x0) {
      iVar3 = pAVar4->Id;
    }
    ppAVar9 = &pObj_00->pFanin1;
    iVar2 = Vec_IntEntry(vPrios,iVar3);
    iVar3 = -1;
    if (*ppAVar9 != (Aig_Obj_t *)0x0) {
      iVar3 = *(int *)(((ulong)*ppAVar9 & 0xfffffffffffffffe) + 0x24);
    }
    iVar3 = Vec_IntEntry(vPrios,iVar3);
    if (iVar2 <= iVar3) {
      ppAVar9 = &pObj_00->pFanin0;
    }
LAB_004a964e:
    pObj = (Aig_Obj_t *)((ulong)*ppAVar9 & 0xfffffffffffffffe);
  }
  goto LAB_004a954c;
}

Assistant:

void Saig_RefManFindReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vPrios, Vec_Int_t * vReasons )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vReasons, Aig_ObjCioId(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( pObj->fPhase )
    {
        Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
    }
    else
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        else if ( fPhase0 && !fPhase1 )
            Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        else 
        {
            int iPrio0 = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
            int iPrio1 = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
            if ( iPrio0 <= iPrio1 )
                Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
            else
                Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        }
    }
}